

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraSublimeTextGenerator::ComputeFlagsForObject_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *gtgt)

{
  ulong uVar1;
  cmMakefile *this_00;
  string *psVar2;
  char *expression;
  char *coptions;
  undefined1 local_190 [8];
  string COMPILE_OPTIONS;
  char *cflags;
  undefined1 local_160 [8];
  string COMPILE_FLAGS;
  string local_120;
  undefined1 local_100 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  string local_90;
  string *local_70;
  string *config;
  undefined1 local_58 [8];
  string language;
  cmGeneratorTarget *gtgt_local;
  cmLocalGenerator *lg_local;
  cmSourceFile *source_local;
  cmExtraSublimeTextGenerator *this_local;
  string *flags;
  
  language.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cmSourceFile::GetLanguage_abi_cxx11_((string *)local_58,source);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_58,"C");
  }
  this_00 = cmLocalGenerator::GetMakefile(lg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_BUILD_TYPE",
             (allocator<char> *)(genexInterpreter.Language.field_2._M_local_buf + 0xf));
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)(genexInterpreter.Language.field_2._M_local_buf + 0xf));
  local_70 = psVar2;
  cmLocalGenerator::GetTargetCompileFlags(lg,gtgt,psVar2,(string *)local_58,__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_120,(string *)local_70);
  std::__cxx11::string::string
            ((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8),(string *)local_58);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_100,lg,&local_120,gtgt,
             (string *)((long)&COMPILE_FLAGS.field_2 + 8));
  std::__cxx11::string::~string((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_160,"COMPILE_FLAGS",(allocator<char> *)((long)&cflags + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cflags + 7));
  COMPILE_OPTIONS.field_2._8_8_ = cmSourceFile::GetProperty(source,(string *)local_160);
  if ((char *)COMPILE_OPTIONS.field_2._8_8_ != (char *)0x0) {
    psVar2 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_100,
                        (char *)COMPILE_OPTIONS.field_2._8_8_,(string *)local_160);
    (*lg->_vptr_cmLocalGenerator[6])(lg,__return_storage_ptr__,psVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_190,"COMPILE_OPTIONS",(allocator<char> *)((long)&coptions + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&coptions + 7));
  expression = cmSourceFile::GetProperty(source,(string *)local_190);
  if (expression != (char *)0x0) {
    psVar2 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_100,expression,(string *)local_190
                       );
    cmLocalGenerator::AppendCompileOptions(lg,__return_storage_ptr__,psVar2,(char *)0x0);
  }
  language.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)local_160);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_100);
  std::__cxx11::string::~string((string *)local_58);
  if ((language.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeFlagsForObject(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* gtgt)
{
  std::string flags;
  std::string language = source->GetLanguage();
  if (language.empty()) {
    language = "C";
  }
  std::string const& config =
    lg->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  lg->GetTargetCompileFlags(gtgt, config, language, flags);

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, gtgt,
                                                    language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (const char* cflags = source->GetProperty(COMPILE_FLAGS)) {
    lg->AppendFlags(flags, genexInterpreter.Evaluate(cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (const char* coptions = source->GetProperty(COMPILE_OPTIONS)) {
    lg->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(coptions, COMPILE_OPTIONS));
  }

  return flags;
}